

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

ProcessorInstance * __thiscall
soul::ResolutionPass::ProcessorInstanceResolver::visit
          (ProcessorInstanceResolver *this,ProcessorInstance *instance)

{
  size_t *psVar1;
  function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__x;
  Expression *pEVar2;
  UnqualifiedName *pUVar3;
  pointer ppVar4;
  string *psVar5;
  pointer pcVar6;
  Allocator *pAVar7;
  string_view firstReplacement;
  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
  *params;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  Scope *pSVar11;
  Graph *g;
  long *plVar12;
  Namespace *pNVar13;
  ModuleBase *pMVar14;
  UTF8Reader this_00;
  ProcessorRef *pPVar15;
  undefined8 uVar16;
  long lVar17;
  size_type *psVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  Scope *s;
  string_view firstToReplace;
  pool_ref<soul::AST::ProcessorBase> target;
  pool_ptr<soul::AST::ProcessorBase> p;
  string nameRoot;
  function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  oldCloneFn;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs;
  size_t in_stack_fffffffffffffcf8;
  pointer ppVar19;
  _Any_data local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_2d8;
  pool_ref<soul::AST::ProcessorBase> local_2a0;
  UTF8Reader local_298;
  string local_290;
  _Any_data local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_230;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  pool_ptr<soul::AST::Expression> local_138;
  IdentifierPath local_130;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  undefined4 extraout_var_00;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,instance);
  pEVar2 = (instance->targetProcessor).object;
  if (pEVar2 == (Expression *)0x0) {
LAB_00211fe5:
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_298);
  if ((ModuleBase *)local_298.data == (ModuleBase *)0x0) {
    if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors ==
        false) {
      pEVar2 = (instance->targetProcessor).object;
      if (pEVar2 != (Expression *)0x0) {
        CompileMessageHelpers::createMessage<>(&local_68,syntax,error,"Expected a processor name");
        AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_68,false)
        ;
      }
      goto LAB_00211fe5;
    }
    psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails;
    *psVar1 = *psVar1 + 1;
  }
  else if ((ProcessorInstance *)(((CodeLocation *)(local_298.data + 0x120))->sourceCode).object !=
           instance) {
    local_138.object = (instance->specialisationArgs).object;
    AST::CommaSeparatedList::getAsExpressionList(&local_230,&local_138);
    this_00.data = local_298.data;
    if ((ModuleBase *)local_298.data == (ModuleBase *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    local_2a0.object = (ProcessorBase *)local_298.data;
    params = (vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
              *)(local_298.data + 0x50);
    bVar9 = ModuleInstanceResolver::validateSpecialisationArgs
                      (&this->super_ModuleInstanceResolver,&local_230,params,
                       (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                       ignoreErrors);
    if (bVar9) {
      pSVar11 = (instance->super_ASTObject).context.parentScope;
      do {
        iVar10 = (*pSVar11->_vptr_Scope[6])(pSVar11);
        if (CONCAT44(extraout_var,iVar10) != 0) {
          g = (Graph *)__dynamic_cast(CONCAT44(extraout_var,iVar10),&AST::ProcessorBase::typeinfo,
                                      &AST::Graph::typeinfo,0);
          if (g != (Graph *)0x0) {
            SanityCheckPass::RecursiveGraphDetector::check(g,(RecursiveGraphDetector *)0x0);
            if ((instance->implicitInstanceSource).object == (SharedEndpoint *)0x0) {
              pUVar3 = (instance->instanceName).object;
              if (pUVar3 == (UnqualifiedName *)0x0) {
                throwInternalCompilerError("object != nullptr","operator->",0x3c);
              }
              IdentifierPath::IdentifierPath(&local_130,(pUVar3->identifier).name);
              AST::Scope::getMatchingSubModules
                        ((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                          *)&local_2f8,&(g->super_ProcessorBase).super_ModuleBase.super_Scope,
                         &local_130);
              uVar8 = local_2f8._M_unused._0_8_;
              uVar16 = local_2f8._8_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_unused._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_2f8._M_unused._M_object,
                                local_2e8._M_allocated_capacity - local_2f8._0_8_);
              }
              local_130.pathSections.numActive = 0;
              if (8 < local_130.pathSections.numAllocated) {
                if (local_130.pathSections.items != (Identifier *)0x0) {
                  operator_delete__(local_130.pathSections.items);
                }
                local_130.pathSections.items = (Identifier *)local_130.pathSections.space;
                local_130.pathSections.numAllocated = 8;
              }
              if (uVar8 != uVar16) {
                AST::ProcessorInstance::getReadableName_abi_cxx11_((string *)&local_2f8,instance);
                CompileMessageHelpers::createMessage<std::__cxx11::string>
                          (&local_d8,(CompileMessageHelpers *)0x1,none,0x2a1225,
                           local_2f8._M_pod_data,in_R9);
                AST::Context::throwError(&(instance->super_ASTObject).context,&local_d8,false);
              }
            }
            bVar9 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                              (&this->super_ModuleInstanceResolver,&local_230,params);
            lVar17 = 0x28;
            if (bVar9) {
              ppVar19 = (((vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                           *)(this_00.data + 0x50))->
                        super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              ppVar4 = *(pointer *)(this_00.data + 0x58);
              if ((ppVar19 != ppVar4) ||
                 ((((CodeLocation *)(this_00.data + 0x120))->sourceCode).object !=
                  (SourceCodeText *)0x0)) {
                psVar5 = ((Identifier *)(this_00.data + 0x40))->name;
                if (psVar5 == (string *)0x0) {
                  throwInternalCompilerError("isValid()","toString",0x23);
                }
                local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
                pcVar6 = (psVar5->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_290,pcVar6,pcVar6 + psVar5->_M_string_length);
                if (ppVar19 != ppVar4) {
                  (*(g->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[0xd])
                            (&local_2f8,g);
                  IdentifierPath::toString_abi_cxx11_(&local_1d8,(IdentifierPath *)&local_2f8);
                  firstReplacement._M_str = (char *)ppVar19;
                  firstReplacement._M_len = in_stack_fffffffffffffcf8;
                  firstToReplace._M_str = (char *)0x1;
                  firstToReplace._M_len = (size_t)":";
                  choc::text::replace<std::__cxx11::string>
                            (&local_1b8,(text *)&local_1d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x1,firstToReplace,firstReplacement);
                  plVar12 = (long *)std::__cxx11::string::append((char *)&local_1b8);
                  psVar18 = (size_type *)(plVar12 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar12 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar18) {
                    local_250.field_2._M_allocated_capacity = *psVar18;
                    local_250.field_2._8_8_ = plVar12[3];
                    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                  }
                  else {
                    local_250.field_2._M_allocated_capacity = *psVar18;
                    local_250._M_dataplus._M_p = (pointer)*plVar12;
                  }
                  local_250._M_string_length = plVar12[1];
                  *plVar12 = (long)psVar18;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  pUVar3 = (instance->instanceName).object;
                  if (pUVar3 == (UnqualifiedName *)0x0) {
                    throwInternalCompilerError("object != nullptr","operator->",0x3c);
                  }
                  AST::UnqualifiedName::toString_abi_cxx11_(&local_1f8,pUVar3);
                  std::operator+(&local_198,&local_250,&local_1f8);
                  makeSafeIdentifierName(&local_178,&local_198);
                  std::operator+(&local_158,"_for_",&local_178);
                  TokenisedPathString::join((string *)&local_270,&local_290,&local_158);
                  std::__cxx11::string::operator=
                            ((string *)&local_290,(string *)local_270._M_pod_data);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_270._M_unused._0_8_ != &local_260) {
                    operator_delete(local_270._M_unused._M_object,
                                    (ulong)(local_260._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158._M_dataplus._M_p != &local_158.field_2) {
                    operator_delete(local_158._M_dataplus._M_p,
                                    local_158.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_178._M_dataplus._M_p != &local_178.field_2) {
                    operator_delete(local_178._M_dataplus._M_p,
                                    local_178.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198._M_dataplus._M_p != &local_198.field_2) {
                    operator_delete(local_198._M_dataplus._M_p,
                                    local_198.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_250._M_dataplus._M_p != &local_250.field_2) {
                    operator_delete(local_250._M_dataplus._M_p,
                                    local_250.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                    operator_delete(local_1b8._M_dataplus._M_p,
                                    local_1b8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                    operator_delete(local_1d8._M_dataplus._M_p,
                                    local_1d8.field_2._M_allocated_capacity + 1);
                  }
                  local_2f8._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  if ((8 < local_2e8._M_allocated_capacity) &&
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f8._M_unused._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0)) {
                    operator_delete__(local_2f8._M_unused._M_object);
                  }
                }
                pNVar13 = AST::ModuleBase::getNamespace((ModuleBase *)this_00.data);
                pAVar7 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor
                         .allocator;
                AST::Scope::makeUniqueName
                          ((string *)&local_2f8,&(pNVar13->super_ModuleBase).super_Scope,&local_290)
                ;
                if (*(_Manager_type *)(this_00.data + 0xd8) == (_Manager_type)0x0) {
                  std::__throw_bad_function_call();
                }
                pMVar14 = (**(_Invoker_type *)(this_00.data + 0xe0))
                                    ((_Any_data *)(this_00.data + 200),pAVar7,pNVar13,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&local_2f8);
                this_00.data = (char *)__dynamic_cast(pMVar14,&AST::ModuleBase::typeinfo,
                                                      &AST::ProcessorBase::typeinfo,0);
                if ((ProcessorBase *)this_00.data == (ProcessorBase *)0x0) {
                  throwInternalCompilerError("object != nullptr","operator*",0x3b);
                }
                local_2a0.object = (ProcessorBase *)this_00.data;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f8._M_unused._0_8_ != &local_2e8) {
                  operator_delete(local_2f8._M_unused._M_object,local_2e8._M_allocated_capacity + 1)
                  ;
                }
                if (ppVar19 != ppVar4) {
                  __x = &(((ProcessorBase *)this_00.data)->super_ModuleBase).createClone;
                  std::
                  function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::function((function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&local_270,__x);
                  std::
                  function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::function((function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&local_2f8,
                             (function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&local_270);
                  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::
                  ArrayWithPreallocation(&local_2d8,&local_230);
                  std::
                  function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
                  ::operator=((function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
                               *)__x,(anon_class_88_2_5590cdb4 *)&local_2f8);
                  visit(soul::AST::ProcessorInstance&)::
                  {lambda(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)#1}
                  ::~basic_string((_lambda_soul__AST__Allocator__soul__AST__Namespace__std____cxx11__string_const___1_
                                   *)local_2f8._M_pod_data);
                  ModuleInstanceResolver::resolveAllSpecialisationArgs
                            (&local_230,
                             &(((ProcessorBase *)this_00.data)->super_ModuleBase).
                              specialisationParams);
                  if ((code *)local_260._M_allocated_capacity != (code *)0x0) {
                    (*(code *)local_260._M_allocated_capacity)(&local_270,&local_270,3);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._M_dataplus._M_p != &local_290.field_2) {
                  operator_delete(local_290._M_dataplus._M_p,
                                  local_290.field_2._M_allocated_capacity + 1);
                }
              }
              (((ProcessorBase *)this_00.data)->owningInstance).object = instance;
              (((ProcessorBase *)this_00.data)->originalBeforeSpecialisation).object =
                   (ProcessorBase *)local_298.data;
              pPVar15 = PoolAllocator::
                        allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::pool_ref<soul::AST::ProcessorBase>&>
                                  (&((this->super_ModuleInstanceResolver).
                                     super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                                   &(instance->super_ASTObject).context,&local_2a0);
              (instance->targetProcessor).object = &pPVar15->super_Expression;
              (instance->specialisationArgs).object = (Expression *)0x0;
              lVar17 = 8;
            }
            goto LAB_00211f82;
          }
          break;
        }
        iVar10 = (*pSVar11->_vptr_Scope[4])(pSVar11);
        pSVar11 = (Scope *)CONCAT44(extraout_var_00,iVar10);
      } while (pSVar11 != (Scope *)0x0);
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    lVar17 = 0x28;
    if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors ==
        false) {
      (**(code **)(*(long *)this_00.data + 0x70))(&local_2f8,this_00.data);
      CompileMessageHelpers::createMessage<soul::IdentifierPath>
                (&local_a0,syntax,error,"Wrong number of arguments to instantiate namespace $Q0$",
                 (IdentifierPath *)&local_2f8);
      AST::Context::throwError(&(instance->super_ASTObject).context,&local_a0,false);
    }
LAB_00211f82:
    plVar12 = (long *)((long)&(this->super_ModuleInstanceResolver).
                              super_ErrorIgnoringRewritingASTVisitor.super_RewritingASTVisitor.
                              _vptr_RewritingASTVisitor + lVar17);
    *plVar12 = *plVar12 + 1;
    local_230.numActive = 0;
    if ((4 < local_230.numAllocated) && (local_230.items != (pool_ref<soul::AST::Expression> *)0x0))
    {
      operator_delete__(local_230.items);
    }
  }
  return instance;
}

Assistant:

AST::ProcessorInstance& visit (AST::ProcessorInstance& instance) override
        {
            super::visit (instance);

            if (auto p = instance.targetProcessor->getAsProcessor())
            {
                if (p->owningInstance == instance)
                    return instance;

                auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (instance.specialisationArgs);
                auto target = pool_ref<AST::ProcessorBase> (*p);

                if (! validateSpecialisationArgs (specialisationArgs, target->specialisationParams, ignoreErrors))
                {
                    if (ignoreErrors)
                    {
                        ++numFails;
                        return instance;
                    }

                    instance.context.throwError (Errors::wrongNumArgsForNamespace (target->getFullyQualifiedDisplayPath()));
                }

                auto& graph = *cast<AST::Graph> (instance.getParentScope()->findProcessor());
                SanityCheckPass::RecursiveGraphDetector::check (graph);

                if (! instance.isImplicitlyCreated())
                    if (! graph.getMatchingSubModules (instance.instanceName->getIdentifierPath()).empty())
                        instance.context.throwError (Errors::alreadyProcessorWithName (instance.getReadableName()));

                if (! canResolveAllSpecialisationArgs (specialisationArgs, target->specialisationParams))
                {
                    ++numFails;
                    return instance;
                }

                bool requiresSpecialisation = ! target->specialisationParams.empty();

                if (target->owningInstance != nullptr || requiresSpecialisation)
                {
                    auto nameRoot = target->name.toString();

                    if (requiresSpecialisation)
                        nameRoot = TokenisedPathString::join (nameRoot,
                                                              "_for_" + makeSafeIdentifierName (choc::text::replace (graph.getFullyQualifiedPath().toString(), ":", "_")
                                                                  + "_" + instance.instanceName->toString()));
                    auto& ns = target->getNamespace();
                    target = *cast<AST::ProcessorBase> (target->createClone (allocator, ns, ns.makeUniqueName (nameRoot)));

                    if (requiresSpecialisation)
                    {
                        auto oldCloneFn = target->createClone;

                        target->createClone = [=] (AST::Allocator& a, AST::Namespace& parentNS, const std::string& newName) -> AST::ModuleBase&
                        {
                            auto& m = oldCloneFn (a, parentNS, newName);
                            resolveAllSpecialisationArgs (specialisationArgs, m.specialisationParams);
                            return m;
                        };

                        resolveAllSpecialisationArgs (specialisationArgs, target->specialisationParams);
                    }
                }

                target->owningInstance = instance;
                target->originalBeforeSpecialisation = p;
                instance.targetProcessor = allocator.allocate<AST::ProcessorRef> (instance.context, target);
                instance.specialisationArgs = nullptr;
                ++itemsReplaced;
                return instance;
            }

            if (! ignoreErrors)
                instance.targetProcessor->context.throwError (Errors::expectedProcessorName());

            ++numFails;
            return instance;
        }